

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::EndQuery(DeviceContextGLImpl *this,IQuery *pQuery)

{
  undefined *puVar1;
  PFNGLQUERYCOUNTERPROC p_Var2;
  GLuint GVar3;
  DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc> *this_00;
  QueryDesc *pQVar4;
  undefined8 uVar5;
  Char *pCVar6;
  undefined1 local_130 [8];
  string msg_5;
  string msg_4;
  undefined1 local_e8 [4];
  GLenum err_4;
  string _msg;
  string msg_3;
  undefined1 local_a0 [4];
  GLenum err_3;
  string msg_2;
  undefined1 local_78 [4];
  GLenum err_2;
  string msg_1;
  GLenum err_1;
  undefined1 local_48 [8];
  string msg;
  GLenum err;
  QUERY_TYPE QueryType;
  QueryGLImpl *pQueryGLImpl;
  IQuery *pQuery_local;
  DeviceContextGLImpl *this_local;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::EndQuery
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pQuery,0);
  this_00 = (DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
             *)ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  pQVar4 = DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>::
           GetDesc(this_00);
  p_Var2 = __glewQueryCounter;
  msg.field_2._12_4_ = pQVar4->Type;
  switch(msg.field_2._12_4_) {
  case 1:
    (*__glewEndQuery)(0x8914);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[38],char[17],unsigned_int>
                (false,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x672,(char (*) [38])"Failed to end GL_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_48,(char (*) [6])0x4585f6);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x672);
      std::__cxx11::string::~string((string *)local_48);
    }
    break;
  case 2:
    (*__glewEndQuery)(0x8c2f);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[42],char[17],unsigned_int>
                (false,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x678,(char (*) [42])"Failed to end GL_ANY_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_78,(char (*) [6])0x4585f6);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x678);
      std::__cxx11::string::~string((string *)local_78);
    }
    break;
  case 3:
    if (__glewQueryCounter == (PFNGLQUERYCOUNTERPROC)0x0) {
      if ((EndQuery::IsFirstTime & 1U) != 0) {
        FormatString<char[47]>
                  ((string *)local_e8,
                   (char (*) [47])"Timer queries are not supported by this device");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_e8);
        EndQuery::IsFirstTime = false;
      }
    }
    else {
      GVar3 = QueryGLImpl::GetGlQueryHandle((QueryGLImpl *)this_00);
      (*p_Var2)(GVar3,0x8e28);
      msg_3.field_2._12_4_ = glGetError();
      if (msg_3.field_2._12_4_ != 0) {
        LogError<false,char[22],char[17],unsigned_int>
                  (false,"EndQuery",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x687,(char (*) [22])"glQueryCounter failed",(char (*) [17])"\nGL Error Code: ",
                   (uint *)(msg_3.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)((long)&_msg.field_2 + 8),(char (*) [6])0x4585f6);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"EndQuery",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x687);
        std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
      }
    }
    break;
  case 4:
    (*__glewEndQuery)(0x8c87);
    msg_2.field_2._12_4_ = glGetError();
    if (msg_2.field_2._12_4_ != 0) {
      LogError<false,char[44],char[17],unsigned_int>
                (false,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x67e,(char (*) [44])"Failed to end GL_PRIMITIVES_GENERATED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_a0,(char (*) [6])0x4585f6);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x67e);
      std::__cxx11::string::~string((string *)local_a0);
    }
    break;
  case 5:
    (*__glewEndQuery)(0x88bf);
    msg_4.field_2._12_4_ = glGetError();
    if (msg_4.field_2._12_4_ != 0) {
      LogError<false,char[36],char[17],unsigned_int>
                (false,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x693,(char (*) [36])"Failed to end GL_TIME_ELAPSED query",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)((long)&msg_5.field_2 + 8),(char (*) [6])0x4585f6);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x693);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    break;
  default:
    FormatString<char[22]>((string *)local_130,(char (*) [22])"Unexpected query type");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x69a);
    std::__cxx11::string::~string((string *)local_130);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::EndQuery(IQuery* pQuery)
{
    TDeviceContextBase::EndQuery(pQuery, 0);

    QueryGLImpl* pQueryGLImpl = ClassPtrCast<QueryGLImpl>(pQuery);
    QUERY_TYPE   QueryType    = pQueryGLImpl->GetDesc().Type;
    switch (QueryType)
    {
        case QUERY_TYPE_OCCLUSION:
#if GL_SAMPLES_PASSED
            glEndQuery(GL_SAMPLES_PASSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_SAMPLES_PASSED query");
#endif
            break;

        case QUERY_TYPE_BINARY_OCCLUSION:
            glEndQuery(GL_ANY_SAMPLES_PASSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_ANY_SAMPLES_PASSED query");
            break;

        case QUERY_TYPE_PIPELINE_STATISTICS:
#if GL_PRIMITIVES_GENERATED
            glEndQuery(GL_PRIMITIVES_GENERATED);
            DEV_CHECK_GL_ERROR("Failed to end GL_PRIMITIVES_GENERATED query");
#endif
            break;

        case QUERY_TYPE_TIMESTAMP:
#if GL_TIMESTAMP
            if (glQueryCounter != nullptr)
            {
                glQueryCounter(pQueryGLImpl->GetGlQueryHandle(), GL_TIMESTAMP);
                DEV_CHECK_GL_ERROR("glQueryCounter failed");
            }
            else
#endif
            {
                LOG_ERROR_MESSAGE_ONCE("Timer queries are not supported by this device");
            }
            break;

        case QUERY_TYPE_DURATION:
#if GL_TIME_ELAPSED
            glEndQuery(GL_TIME_ELAPSED);
            DEV_CHECK_GL_ERROR("Failed to end GL_TIME_ELAPSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("Duration queries are not supported by this device");
#endif
            break;

        default:
            UNEXPECTED("Unexpected query type");
    }
}